

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PParse.hpp
# Opt level: O3

ostream * operator<<(ostream *target,StrX *toDump)

{
  char *__s;
  size_t sVar1;
  
  __s = toDump->fLocalForm;
  if (__s == (char *)0x0) {
    std::ios::clear((int)target + (int)*(undefined8 *)(*(long *)target + -0x18));
  }
  else {
    sVar1 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>(target,__s,sVar1);
  }
  return target;
}

Assistant:

inline std::ostream& operator<<(std::ostream& target, const StrX& toDump)
{
    target << toDump.localForm();
    return target;
}